

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

UtestShell * __thiscall TestRegistry::findTestWithGroup(TestRegistry *this,SimpleString *group)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_RDI;
  UtestShell *current;
  UtestShell *this_00;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  UtestShell *local_20;
  
  local_20 = *(UtestShell **)(in_RDI + 8);
  while( true ) {
    if (local_20 == (UtestShell *)0x0) {
      return (UtestShell *)0x0;
    }
    this_00 = (UtestShell *)&stack0xffffffffffffffd0;
    UtestShell::getGroup(this_00);
    bVar1 = operator==((SimpleString *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,(SimpleString *)this_00);
    in_stack_ffffffffffffffc0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
    SimpleString::~SimpleString((SimpleString *)0x126ca5);
    if ((in_stack_ffffffffffffffc0 & 0x1000000) != 0) break;
    iVar2 = (*local_20->_vptr_UtestShell[3])();
    local_20 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  return local_20;
}

Assistant:

UtestShell* TestRegistry::findTestWithGroup(const SimpleString& group)
{
    UtestShell* current = tests_;
    while (current) {
        if (current->getGroup() == group)
            return current;
        current = current->getNext();
    }
    return NULLPTR;
}